

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_huge_rpm.c
# Opt level: O1

void test_read_format_huge_rpm(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *v2;
  archive_entry *ae;
  archive_entry *local_30;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                   ,L'!',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'#',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file("test_read_format_huge_rpm.rpm");
  wVar2 = archive_read_open_filename(a,"test_read_format_huge_rpm.rpm",2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'%',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 2)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'(',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'+',8,"ARCHIVE_FILTER_RPM",(long)iVar1,"archive_filter_code(a, 0)",
                      (void *)0x0);
  v2 = archive_filter_name((archive *)a,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
             ,L',',"rpm","\"rpm\"",v2,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'-',0x60000,"ARCHIVE_FORMAT_EMPTY",(long)iVar1,"archive_format(a)",
                      (void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_huge_rpm.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_huge_rpm)
{
	struct archive_entry *ae;
	struct archive *a;
	const char *name = "test_read_format_huge_rpm.rpm";

	assert((a = archive_read_new()) != NULL);
        assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 2));

	/* This archive should have no entries -- if it has entries, the bid has screwed up */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(ARCHIVE_FILTER_RPM, archive_filter_code(a, 0));
	assertEqualString("rpm", archive_filter_name(a, 0));
	assertEqualInt(ARCHIVE_FORMAT_EMPTY, archive_format(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}